

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knowledge_dynamics.cc
# Opt level: O3

int explode::knowledge_dynamics::accept(int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int iVar1;
  input *piVar2;
  undefined4 in_register_0000003c;
  char local_1b;
  char local_1a;
  char local_19;
  uint8_t bytes [3];
  
  piVar2 = input_exe_file::file((input_exe_file *)CONCAT44(in_register_0000003c,__fd));
  (*piVar2->_vptr_input[5])(piVar2,0x200);
  iVar1 = (*piVar2->_vptr_input[2])(piVar2,&local_1b,3);
  return CONCAT31((int3)((uint)iVar1 >> 8),
                  (local_1a == -0x67 && local_1b == -0x17) && local_19 == '\0');
}

Assistant:

bool knowledge_dynamics::accept(input_exe_file& inp)
  {
    input& f = inp.file();
    uint8_t bytes[3];
    f.seek(0x200);
    // e9 99 00
    f.read_buff(reinterpret_cast <char*>(bytes), 3);
    if (bytes[0] != 0xE9 || bytes[1] != 0x99 || bytes[2] != 0x00)
      {
	return false;
      }
    return true;
  }